

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::interface_to_endpoints
          (aux *this,listen_interface_t *iface,listen_socket_flags_t flags,
          span<const_libtorrent::aux::ip_interface> ifs,
          vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
          *eps)

{
  ip_interface *__args;
  bool bVar1;
  char *str;
  undefined7 in_register_00000011;
  bool local_d9;
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_bc;
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_bb;
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_ba;
  bool local_b9;
  ip_interface *piStack_b8;
  bool local;
  ip_interface *ipface;
  ip_interface *__end3;
  ip_interface *__begin3;
  span<const_libtorrent::aux::ip_interface> *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  address adr;
  error_code err;
  transport ssl;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  *eps_local;
  listen_interface_t *iface_local;
  span<const_libtorrent::aux::ip_interface> ifs_local;
  listen_socket_flags_t flags_local;
  
  iface_local = (listen_interface_t *)CONCAT71(in_register_00000011,flags.m_val);
  ifs_local.m_ptr = ifs.m_ptr;
  ifs_local.m_len._7_1_ = (uchar)iface;
  if (((byte)this[0x25] & 1) == 0) {
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
    ::bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> *)
                    ((long)&err.cat_ + 7));
  }
  else {
    err.cat_._7_1_ = '\x02';
  }
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>::
  operator|=((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> *)
             ((long)&ifs_local.m_len + 7),err.cat_._7_1_);
  err.cat_._6_1_ = ((byte)this[0x24] & 1) != 0;
  boost::system::error_code::error_code((error_code *)&adr.ipv6_address_.scope_id_);
  str = (char *)::std::__cxx11::string::c_str();
  boost::asio::ip::make_address((address *)local_68,str,(error_code *)&adr.ipv6_address_.scope_id_);
  bVar1 = boost::system::error_code::operator_cast_to_bool
                    ((error_code *)&adr.ipv6_address_.scope_id_);
  if (bVar1) {
    __range3._3_1_ = 4;
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
    ::operator|=((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> *)
                 ((long)&ifs_local.m_len + 7),
                 (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>)0x4);
    __begin3 = (ip_interface *)&iface_local;
    __end3 = span<const_libtorrent::aux::ip_interface>::begin
                       ((span<const_libtorrent::aux::ip_interface> *)__begin3);
    ipface = span<const_libtorrent::aux::ip_interface>::end
                       ((span<const_libtorrent::aux::ip_interface> *)__begin3);
    for (; __end3 != ipface; __end3 = __end3 + 1) {
      piStack_b8 = __end3;
      bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this,__end3->name);
      if (!bVar1) {
        local_d9 = true;
        if (((byte)this[0x25] & 1) == 0) {
          bVar1 = boost::asio::ip::address::is_loopback(&piStack_b8->interface_address);
          local_d9 = true;
          if (!bVar1) {
            local_d9 = is_link_local(&piStack_b8->interface_address);
          }
        }
        __args = piStack_b8;
        local_b9 = local_d9;
        local_bb.m_val = ifs_local.m_len._7_1_;
        if (local_d9 == false) {
          libtorrent::flags::
          bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>::
          bitfield_flag(&local_bc);
        }
        else {
          local_bc.m_val = '\x02';
        }
        local_ba = libtorrent::flags::operator|(local_bb,local_bc);
        ::std::
        vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
        ::
        emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string_const&,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>>
                  ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
                    *)ifs.m_len,&__args->interface_address,(int *)(this + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (transport *)((long)&err.cat_ + 6),&local_ba);
      }
    }
  }
  else {
    ::std::__cxx11::string::string((string *)&local_88);
    ::std::
    vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
    emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>&>
              ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
                *)ifs.m_len,(address *)local_68,(int *)(this + 0x20),&local_88,
               (transport *)((long)&err.cat_ + 6),
               (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> *)
               ((long)&ifs_local.m_len + 7));
    ::std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void interface_to_endpoints(listen_interface_t const& iface
		, listen_socket_flags_t flags
		, span<ip_interface const> const ifs
		, std::vector<listen_endpoint_t>& eps)
	{
		flags |= iface.local ? listen_socket_t::local_network : listen_socket_flags_t{};
		transport const ssl = iface.ssl ? transport::ssl : transport::plaintext;

		// First, check to see if it's an IP address
		error_code err;
		address const adr = make_address(iface.device.c_str(), err);
		if (!err)
		{
			eps.emplace_back(adr, iface.port, std::string{}, ssl, flags);
		}
		else
		{
			flags |= listen_socket_t::was_expanded;

			// this is the case where device names a network device. We need to
			// enumerate all IPs associated with this device
			for (auto const& ipface : ifs)
			{
				// we're looking for a specific interface, and its address
				// (which must be of the same family as the address we're
				// connecting to)
				if (iface.device != ipface.name) continue;

				bool const local = iface.local
					|| ipface.interface_address.is_loopback()
					|| is_link_local(ipface.interface_address);

				eps.emplace_back(ipface.interface_address, iface.port, iface.device
					, ssl, flags | (local ? listen_socket_t::local_network : listen_socket_flags_t{}));
			}
		}
	}